

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall LiteralsTest_Format_Test::TestBody(LiteralsTest_Format_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> udl_format_w;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> udl_format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int line;
  char *file;
  undefined4 in_stack_ffffffffffffff08;
  Type in_stack_ffffffffffffff0c;
  AssertHelper *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  wchar_t (*in_stack_ffffffffffffff20) [3];
  udl_formatter<wchar_t,_L___,_L___,_L_c_,_L___,_L___> *in_stack_ffffffffffffff28;
  wchar_t (*in_stack_ffffffffffffff30) [3];
  wchar_t (*in_stack_ffffffffffffff38) [6];
  AssertionResult local_c0;
  undefined4 local_b0;
  Message *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  string local_60 [32];
  AssertionResult local_40;
  undefined4 local_30;
  string local_28 [40];
  
  fmt::v5::literals::operator___format<char,____,____,__c_,____,____>();
  local_30 = 1;
  file = "ab";
  fmt::v5::internal::udl_formatter<char,(char)123,(char)125,(char)99,(char)123,(char)125>::
  operator()((udl_formatter<char,____,____,__c_,____,____> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (char (*) [3])in_stack_ffffffffffffff10,
             (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  fmt::v5::format<char[6],char[3],int>
            ((char (*) [6])in_stack_ffffffffffffff38,(char (*) [3])in_stack_ffffffffffffff30,
             (int *)in_stack_ffffffffffffff28);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
            );
  std::__cxx11::string::~string(local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    in_stack_fffffffffffffef0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x17ce76);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,file,line,
               in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x17ced3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17cf2b);
  fmt::v5::literals::operator___format<wchar_t,_L___,_L___,_L_c_,_L___,_L___>();
  local_b0 = 1;
  fmt::v5::internal::
  udl_formatter<wchar_t,(wchar_t)123,(wchar_t)125,(wchar_t)99,(wchar_t)123,(wchar_t)125>::operator()
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  fmt::v5::format<wchar_t[6],wchar_t[3],int>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::wstring,std::__cxx11::wstring>
            ((char *)CONCAT44(line,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffee0);
  std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffff20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x17d04e)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,file,line,
               in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x17d09c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17d0e8);
  std::__cxx11::wstring::~wstring((wstring *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(LiteralsTest, Format) {
  auto udl_format = "{}c{}"_format("ab", 1);
  EXPECT_EQ(format("{}c{}", "ab", 1), udl_format);
  auto udl_format_w = L"{}c{}"_format(L"ab", 1);
  EXPECT_EQ(format(L"{}c{}", L"ab", 1), udl_format_w);
}